

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_acquire_read(ma_rb *pRB,size_t *pSizeInBytes,void **ppBufferOut)

{
  uint uVar1;
  ulong local_98;
  ulong local_90;
  size_t bytesRequested;
  size_t bytesAvailable;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  void **ppBufferOut_local;
  size_t *pSizeInBytes_local;
  ma_rb *pRB_local;
  
  if (((pRB == (ma_rb *)0x0) || (pSizeInBytes == (size_t *)0x0)) || (ppBufferOut == (void **)0x0)) {
    writeOffset = 0xfffffffe;
  }
  else {
    uVar1 = pRB->encodedReadOffset & 0x7fffffff;
    if ((pRB->encodedReadOffset & 0x80000000) == (pRB->encodedWriteOffset & 0x80000000)) {
      uVar1 = (pRB->encodedWriteOffset & 0x7fffffff) - uVar1;
    }
    else {
      uVar1 = pRB->subbufferSizeInBytes - uVar1;
    }
    local_90 = (ulong)uVar1;
    local_98 = *pSizeInBytes;
    if (local_90 < local_98) {
      local_98 = local_90;
    }
    *pSizeInBytes = local_98;
    *ppBufferOut = (void *)((long)pRB->pBuffer + (ulong)(pRB->encodedReadOffset & 0x7fffffff));
    writeOffset = 0;
  }
  return writeOffset;
}

Assistant:

MA_API ma_result ma_rb_acquire_read(ma_rb* pRB, size_t* pSizeInBytes, void** ppBufferOut)
{
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    size_t bytesAvailable;
    size_t bytesRequested;

    if (pRB == NULL || pSizeInBytes == NULL || ppBufferOut == NULL) {
        return MA_INVALID_ARGS;
    }

    /* The returned buffer should never move ahead of the write pointer. */
    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    /*
    The number of bytes available depends on whether or not the read and write pointers are on the same loop iteration. If so, we
    can only read up to the write pointer. If not, we can only read up to the end of the buffer.
    */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        bytesAvailable = writeOffsetInBytes - readOffsetInBytes;
    } else {
        bytesAvailable = pRB->subbufferSizeInBytes - readOffsetInBytes;
    }

    bytesRequested = *pSizeInBytes;
    if (bytesRequested > bytesAvailable) {
        bytesRequested = bytesAvailable;
    }

    *pSizeInBytes = bytesRequested;
    (*ppBufferOut) = ma_rb__get_read_ptr(pRB);

    return MA_SUCCESS;
}